

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_buffer__do_pushv(ptls_buffer_t *buf,void *src,size_t len)

{
  int iVar1;
  
  iVar1 = 0;
  if ((len != 0) && (iVar1 = ptls_buffer_reserve(buf,len), iVar1 == 0)) {
    memcpy(buf->base + buf->off,src,len);
    buf->off = buf->off + len;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ptls_buffer__do_pushv(ptls_buffer_t *buf, const void *src, size_t len)
{
    int ret;

    if (len == 0)
        return 0;
    if ((ret = ptls_buffer_reserve(buf, len)) != 0)
        return ret;
    memcpy(buf->base + buf->off, src, len);
    buf->off += len;
    return 0;
}